

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

SurfaceInteraction * __thiscall
pbrt::Cylinder::InteractionFromIntersection
          (SurfaceInteraction *__return_storage_ptr__,Cylinder *this,QuadricIntersection *isect,
          Vector3f *wo,Float time)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  Transform *this_00;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined8 uVar10;
  float fVar11;
  undefined1 auVar12 [16];
  Point3fi pi;
  Normal3f dndu;
  Normal3f dndv;
  Vector3f dpdv;
  Vector3f dpdu;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar21 [56];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar22 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  Vector3<float> VVar30;
  Point3f pHit;
  Point3f local_1b8;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [12];
  float fStack_18c;
  undefined1 local_188 [16];
  Tuple3<pbrt::Vector3,_float> local_170;
  Tuple3<pbrt::Vector3,_float> local_160;
  Vector3<float> local_150;
  Point3fi local_140;
  SurfaceInteraction local_128;
  undefined1 auVar23 [60];
  
  local_1b8.super_Tuple3<pbrt::Point3,_float>.z = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.z;
  auVar18 = ZEXT816(0) << 0x40;
  local_1b8.super_Tuple3<pbrt::Point3,_float>.x = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.x;
  local_1b8.super_Tuple3<pbrt::Point3,_float>.y = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.y;
  local_150.super_Tuple3<pbrt::Vector3,_float>.y = this->phiMax;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_1b8.super_Tuple3<pbrt::Point3,_float>._0_8_;
  local_160.z = this->zMax - this->zMin;
  local_150.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  local_160.x = 0.0;
  local_160.y = 0.0;
  auVar17 = vinsertps_avx(ZEXT416((uint)isect->phi),
                          ZEXT416((uint)(local_1b8.super_Tuple3<pbrt::Point3,_float>.z - this->zMin)
                                 ),0x10);
  auVar24 = ZEXT416((uint)local_160.z);
  auVar15 = vinsertps_avx(ZEXT416((uint)local_150.super_Tuple3<pbrt::Vector3,_float>.y),auVar24,0x10
                         );
  local_188 = vdivps_avx(auVar17,auVar15);
  auVar17._8_4_ = 0x80000000;
  auVar17._0_8_ = 0x8000000080000000;
  auVar17._12_4_ = 0x80000000;
  auVar15 = vxorps_avx512vl(ZEXT416((uint)local_150.super_Tuple3<pbrt::Vector3,_float>.y),auVar17);
  fVar4 = local_150.super_Tuple3<pbrt::Vector3,_float>.y * auVar15._0_4_;
  local_150.super_Tuple3<pbrt::Vector3,_float>.y =
       local_150.super_Tuple3<pbrt::Vector3,_float>.y *
       (float)local_1b8.super_Tuple3<pbrt::Point3,_float>.x;
  auVar17 = vmovshdup_avx(auVar26);
  fVar5 = fVar4 * (float)local_1b8.super_Tuple3<pbrt::Point3,_float>.x;
  local_150.super_Tuple3<pbrt::Vector3,_float>.x = auVar17._0_4_ * auVar15._0_4_;
  auVar23 = (undefined1  [60])0x0;
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(local_150.super_Tuple3<pbrt::Vector3,_float>.y * 0.0)),
                            auVar18,ZEXT416((uint)local_150.super_Tuple3<pbrt::Vector3,_float>.x));
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(local_150.super_Tuple3<pbrt::Vector3,_float>.y *
                                          local_150.super_Tuple3<pbrt::Vector3,_float>.y)),
                            ZEXT416((uint)local_150.super_Tuple3<pbrt::Vector3,_float>.x),
                            ZEXT416((uint)local_150.super_Tuple3<pbrt::Vector3,_float>.x));
  auVar21 = ZEXT856(auVar12._8_8_);
  auVar15 = vfmadd231ss_fma(auVar15,auVar18,auVar24);
  auVar24 = vfmadd213ss_fma(auVar24,auVar24,auVar18);
  fVar27 = auVar15._0_4_;
  VVar30 = Cross<float>(&local_150,(Vector3<float> *)&local_160);
  local_128.super_Interaction.pi.super_Point3<pbrt::Interval>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low = VVar30.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar19._0_8_ = VVar30.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar19._8_56_ = auVar21;
  local_128.super_Interaction.pi.super_Point3<pbrt::Interval>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval>.x = (Interval)vmovlps_avx(auVar19._0_16_);
  VVar30 = Normalize<float>((Vector3<float> *)&local_128);
  fVar14 = local_150.super_Tuple3<pbrt::Vector3,_float>.y;
  fVar13 = local_150.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar22._0_4_ = VVar30.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar22._4_60_ = auVar23;
  auVar20._0_8_ = VVar30.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar20._8_56_ = auVar21;
  auVar18 = auVar20._0_16_;
  auVar15 = vmovshdup_avx(auVar18);
  auVar25 = ZEXT816(0) << 0x40;
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(auVar15._0_4_ * fVar4 * auVar17._0_4_)),auVar18,
                            ZEXT416((uint)fVar5));
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(auVar15._0_4_ * 0.0)),auVar25,auVar18);
  auVar18 = vfmadd231ss_fma(auVar17,auVar22._0_16_,ZEXT416((uint)(fVar4 * 0.0)));
  auVar15 = vfmadd231ss_fma(auVar15,auVar25,auVar22._0_16_);
  auVar28._8_4_ = 0x80000000;
  auVar28._0_8_ = 0x8000000080000000;
  auVar28._12_4_ = 0x80000000;
  auVar16 = vxorps_avx512vl(auVar15,auVar28);
  auVar17 = vfmsub213ss_fma(auVar24,ZEXT416((uint)auVar12._0_4_),ZEXT416((uint)(fVar27 * fVar27)));
  auVar29 = ZEXT416((uint)fVar27);
  auVar28 = vfnmadd231ss_fma(ZEXT416((uint)(fVar27 * fVar27)),auVar29,auVar29);
  fVar4 = auVar17._0_4_ + auVar28._0_4_;
  uVar10 = vcmpss_avx512f(ZEXT416((uint)fVar4),auVar25,0);
  fVar11 = (float)((uint)!(bool)((byte)uVar10 & 1) * (int)(1.0 / fVar4));
  auVar28 = ZEXT416((uint)(auVar12._0_4_ * auVar16._0_4_));
  auVar17 = vfmadd213ss_fma(auVar18,auVar29,auVar28);
  auVar12 = vfmsub231ss_fma(ZEXT416((uint)(auVar24._0_4_ * auVar18._0_4_)),auVar15,auVar29);
  fVar4 = fVar11 * auVar17._0_4_;
  fVar5 = fVar11 * auVar12._0_4_;
  fVar6 = local_160.z * fVar4;
  fVar7 = local_150.super_Tuple3<pbrt::Vector3,_float>.z * fVar5;
  auVar24 = vfmsub231ss_fma(ZEXT416((uint)(auVar24._0_4_ * auVar15._0_4_)),auVar15,
                            ZEXT416((uint)fVar27));
  auVar17 = vfmadd213ss_fma(auVar15,ZEXT416((uint)fVar27),auVar28);
  fVar27 = fVar11 * auVar24._0_4_;
  fVar11 = fVar11 * auVar17._0_4_;
  fVar8 = local_150.super_Tuple3<pbrt::Vector3,_float>.z * fVar27;
  fVar9 = local_160.z * fVar11;
  local_198._0_4_ = local_160.x;
  local_198._4_4_ = local_160.y;
  stack0xfffffffffffffe70 = 0;
  auVar15._8_4_ = 0x7fffffff;
  auVar15._0_8_ = 0x7fffffff7fffffff;
  auVar15._12_4_ = 0x7fffffff;
  auVar17 = vandps_avx512vl(auVar26,auVar15);
  auVar24._8_4_ = 0x34400002;
  auVar24._0_8_ = 0x3440000234400002;
  auVar24._12_4_ = 0x34400002;
  auVar17 = vmulps_avx512vl(auVar17,auVar24);
  local_170._0_8_ = vmovlps_avx(auVar17);
  local_170.z = 0.0;
  bVar2 = this->reverseOrientation;
  bVar3 = this->transformSwapsHandedness;
  local_1a8 = local_150.super_Tuple3<pbrt::Vector3,_float>.x * fVar5 + local_160.x * fVar4;
  fStack_1a4 = local_150.super_Tuple3<pbrt::Vector3,_float>.y * fVar5 + local_160.y * fVar4;
  fStack_1a0 = fVar5 * 0.0 + fVar4 * 0.0;
  fStack_19c = fVar5 * 0.0 + fVar4 * 0.0;
  VVar30 = Transform::operator()(this->objectFromRender,wo);
  this_00 = this->renderFromObject;
  Point3fi::Point3fi(&local_140,&local_1b8,(Vector3f *)&local_170);
  auVar12._4_4_ = fStack_1a4;
  auVar12._0_4_ = local_1a8;
  auVar12._8_4_ = fStack_1a0;
  auVar12._12_4_ = fStack_19c;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.y = local_150.super_Tuple3<pbrt::Vector3,_float>.y;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.x = local_150.super_Tuple3<pbrt::Vector3,_float>.x;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.z = local_150.super_Tuple3<pbrt::Vector3,_float>.z;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.z = local_160.z;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.x = local_160.x;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.y = local_160.y;
  uVar10 = vmovlps_avx(auVar12);
  auVar18._0_4_ = fVar27 * fVar13 + fVar11 * (float)local_198._0_4_;
  auVar18._4_4_ = fVar27 * fVar14 + fVar11 * (float)local_198._4_4_;
  auVar18._8_4_ = fVar27 * 0.0 + fVar11 * (float)local_198._8_4_;
  auVar18._12_4_ = fVar27 * 0.0 + fVar11 * fStack_18c;
  uVar1 = vmovlps_avx(auVar18);
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y =
       local_140.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
       local_140.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
       local_140.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
  dndu.super_Tuple3<pbrt::Normal3,_float>.z = fVar6 + fVar7;
  dndu.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar10;
  dndu.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar10 >> 0x20);
  dndv.super_Tuple3<pbrt::Normal3,_float>.z = fVar8 + fVar9;
  dndv.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
  dndv.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  SurfaceInteraction::SurfaceInteraction
            (&local_128,pi,(Point2f)local_188._0_8_,
             (Vector3f)VVar30.super_Tuple3<pbrt::Vector3,_float>,dpdu,dpdv,dndu,dndv,time,
             bVar2 != bVar3);
  Transform::operator()(__return_storage_ptr__,this_00,&local_128);
  return __return_storage_ptr__;
}

Assistant:

InteractionFromIntersection(const QuadricIntersection &isect,
                                                   const Vector3f &wo, Float time) const {
        Point3f pHit = isect.pObj;
        Float phi = isect.phi;
        // Find parametric representation of cylinder hit
        Float u = phi / phiMax;
        Float v = (pHit.z - zMin) / (zMax - zMin);
        // Compute cylinder $\dpdu$ and $\dpdv$
        Vector3f dpdu(-phiMax * pHit.y, phiMax * pHit.x, 0);
        Vector3f dpdv(0, 0, zMax - zMin);

        // Compute cylinder $\dndu$ and $\dndv$
        Vector3f d2Pduu = -phiMax * phiMax * Vector3f(pHit.x, pHit.y, 0);
        Vector3f d2Pduv(0, 0, 0), d2Pdvv(0, 0, 0);
        // Compute coefficients for fundamental forms
        Float E = Dot(dpdu, dpdu);
        Float F = Dot(dpdu, dpdv);
        Float G = Dot(dpdv, dpdv);
        Vector3f N = Normalize(Cross(dpdu, dpdv));
        Float e = Dot(N, d2Pduu);
        Float f = Dot(N, d2Pduv);
        Float g = Dot(N, d2Pdvv);

        // Compute $\dndu$ and $\dndv$ from fundamental form coefficients
        Float EGF2 = DifferenceOfProducts(E, G, F, F);
        Float invEGF2 = (EGF2 == 0) ? Float(0) : 1 / EGF2;
        Normal3f dndu =
            Normal3f((f * F - e * G) * invEGF2 * dpdu + (e * F - f * E) * invEGF2 * dpdv);
        Normal3f dndv =
            Normal3f((g * F - f * G) * invEGF2 * dpdu + (f * F - g * E) * invEGF2 * dpdv);

        // Compute error bounds for cylinder intersection
        Vector3f pError = gamma(3) * Abs(Vector3f(pHit.x, pHit.y, 0));

        // Return _SurfaceInteraction_ for quadric intersection
        bool flipNormal = reverseOrientation ^ transformSwapsHandedness;
        Vector3f woObject = (*objectFromRender)(wo);
        return (*renderFromObject)(SurfaceInteraction(Point3fi(pHit, pError),
                                                      Point2f(u, v), woObject, dpdu, dpdv,
                                                      dndu, dndv, time, flipNormal));
    }